

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void telnet_receive(Plug *plug,int urgent,char *data,size_t len)

{
  byte val;
  char cVar1;
  uint uVar2;
  _Bool _Var3;
  char cVar4;
  undefined4 uVar5;
  strbuf *buf_o;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  PlugVtable *pPVar10;
  size_t sVar11;
  undefined2 *ptr;
  long lVar12;
  Telnet *telnet;
  _func_void_Plug_ptr_int_char_ptr_size_t *p_Var13;
  ulong uVar14;
  uint option;
  _func_void_Plug_ptr_int_char_ptr_size_t *p_Var15;
  char *pcVar16;
  long lVar17;
  LogContext *pLVar18;
  int iVar19;
  bool bVar20;
  char *local_60;
  char *local_58;
  BinarySink *local_50;
  byte *local_48;
  strbuf *local_40;
  Telnet *local_38;
  
  if (urgent != 0) {
    *(undefined1 *)&plug[-5].vt = 1;
  }
  telnet = (Telnet *)(plug + -0x13);
  buf_o = strbuf_new_nm();
  local_50 = buf_o->binarysink_;
  local_38 = telnet;
  do {
    bVar20 = len == 0;
    len = len - 1;
    if (bVar20) {
      if (buf_o->len != 0) {
        c_write(telnet,buf_o->u,buf_o->len);
      }
      strbuf_free(buf_o);
      return;
    }
    uVar2 = *(uint *)&plug[-3].vt;
    if (9 < uVar2) goto LAB_001391a6;
    val = *data;
    option = (uint)val;
    switch(uVar2) {
    default:
      uVar5 = 1;
      if ((val != 0xff) && ((val != 0 || (uVar5 = 0, uVar2 != 9)))) {
        if (*(char *)&plug[-5].vt == '\x01') {
          if (option == 0xd) {
LAB_001391e4:
            uVar5 = 9;
            if (*(int *)((long)&plug[-8].vt + 4) != 1) break;
          }
          else if (val == 0xf2) goto switchD_00139146_caseD_f2;
        }
        else {
          BinarySink_put_byte(local_50,val);
          if (option == 0xd) goto LAB_001391e4;
        }
        goto switchD_00139146_caseD_f3;
      }
      break;
    case 1:
      uVar5 = 4;
      switch(option) {
      case 0xf2:
switchD_00139146_caseD_f2:
        *(undefined1 *)&plug[-5].vt = 0;
      default:
        goto switchD_00139146_caseD_f3;
      case 0xfa:
        uVar5 = 6;
        break;
      case 0xfb:
        uVar5 = 2;
        break;
      case 0xfc:
        uVar5 = 3;
        break;
      case 0xfd:
        break;
      case 0xfe:
        uVar5 = 5;
        break;
      case 0xff:
        BinarySink_put_byte(local_50,0xff);
        goto switchD_00139146_caseD_f3;
      }
      break;
    case 2:
      iVar19 = 0xfb;
      goto LAB_0013917a;
    case 3:
      iVar19 = 0xfc;
      goto LAB_0013917a;
    case 4:
      iVar19 = 0xfd;
      goto LAB_0013917a;
    case 5:
      iVar19 = 0xfe;
LAB_0013917a:
      proc_rec_opt(telnet,iVar19,option);
switchD_00139146_caseD_f3:
      uVar5 = 0;
      break;
    case 6:
      *(uint *)((long)&plug[-5].vt + 4) = option;
      strbuf_clear((strbuf *)plug[-4].vt);
LAB_0013919f:
      uVar5 = 7;
      break;
    case 7:
      uVar5 = 8;
      if (option != 0xff) {
LAB_00139190:
        BinarySink_put_byte((BinarySink *)&(plug[-4].vt)->sent,val);
        goto LAB_0013919f;
      }
      break;
    case 8:
      if (option != 0xf0) goto LAB_00139190;
      iVar19 = *(int *)((long)&plug[-5].vt + 4);
      if (iVar19 == 0x18) {
        if (((plug[-4].vt)->receive == (_func_void_Plug_ptr_int_char_ptr_size_t *)0x1) &&
           (*(plug[-4].vt)->closing == (_func_void_Plug_ptr_PlugCloseType_char_ptr)0x1)) {
          pcVar16 = conf_get_str((Conf *)plug[-2].vt,0x35);
          sVar7 = strlen(pcVar16);
          pcVar8 = (char *)safemalloc(sVar7 + 0x14,1,0);
          pcVar8[0] = -1;
          pcVar8[1] = -6;
          pcVar8[2] = '\x18';
          pcVar8[3] = '\0';
          pcVar6 = pcVar8 + 4;
          for (uVar14 = 6; cVar4 = pcVar16[uVar14 - 6], cVar4 != '\0'; uVar14 = uVar14 + 1) {
            cVar1 = cVar4 + -0x20;
            if (0x19 < (byte)(cVar4 + 0x9fU)) {
              cVar1 = cVar4;
            }
            pcVar8[uVar14 - 2] = cVar1;
          }
          (pcVar8 + (uVar14 - 2))[0] = -1;
          (pcVar8 + (uVar14 - 2))[1] = -0x10;
          pPVar10 = (PlugVtable *)
                    (**(code **)((plug[-0x13].vt)->log + 0x10))
                              (plug[-0x13].vt,pcVar8,uVar14 & 0xffffffff);
          plug[-6].vt = pPVar10;
          pcVar8[uVar14 - 2] = '\0';
          logevent((LogContext *)plug[-0x10].vt,"server subnegotiation: SB TTYPE SEND");
          pLVar18 = (LogContext *)plug[-0x10].vt;
          pcVar16 = "client subnegotiation: SB TTYPE IS %s";
LAB_00139606:
          logeventf(pLVar18,pcVar16,pcVar6);
LAB_00139610:
          safefree(pcVar8);
        }
        else {
          pLVar18 = (LogContext *)plug[-0x10].vt;
          pcVar8 = "server subnegotiation: SB TTYPE <something weird>\r\n";
LAB_0013934e:
          logevent(pLVar18,pcVar8);
        }
      }
      else if ((iVar19 == 0x27) || (iVar19 == 0x24)) {
        p_Var13 = (plug[-4].vt)->receive;
        if ((0 < (long)p_Var13) &&
           (p_Var15 = (_func_void_Plug_ptr_int_char_ptr_size_t *)(plug[-4].vt)->closing,
           *p_Var15 == (_func_void_Plug_ptr_int_char_ptr_size_t)0x1)) {
          pLVar18 = (LogContext *)plug[-0x10].vt;
          local_48 = (byte *)data;
          pcVar8 = telopt(iVar19);
          cVar4 = '\0';
          logeventf(pLVar18,"server subnegotiation: SB %s SEND",pcVar8);
          _Var3 = true;
          if (*(int *)((long)&plug[-5].vt + 4) == 0x24) {
            p_Var13 = p_Var13 + (long)p_Var15;
            _Var3 = conf_get_bool((Conf *)plug[-2].vt,0x3c);
            cVar4 = !_Var3;
            while (p_Var15 = p_Var15 + 1, p_Var15 < p_Var13) {
              cVar1 = (char)*p_Var15;
              if (cVar1 == '\0') {
                _Var3 = true;
                cVar4 = cVar1;
              }
              else if (cVar1 == '\x01') {
                _Var3 = false;
                cVar4 = cVar1;
              }
            }
          }
          pcVar8 = (char *)0x0;
          iVar19 = 0x14;
          local_40 = buf_o;
          while (pcVar6 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,pcVar8,&local_60),
                pcVar8 = local_60, pcVar6 != (char *)0x0) {
            sVar7 = strlen(local_60);
            sVar11 = strlen(pcVar6);
            iVar19 = iVar19 + (int)sVar11 + (int)sVar7 + 2;
          }
          local_58 = get_remote_username((Conf *)plug[-2].vt);
          if (local_58 != (char *)0x0) {
            sVar7 = strlen(local_58);
            iVar19 = iVar19 + (int)sVar7 + 6;
          }
          ptr = (undefined2 *)safemalloc((long)iVar19,1,0);
          *ptr = 0xfaff;
          *(undefined1 *)(ptr + 1) = *(undefined1 *)((long)&plug[-5].vt + 4);
          *(undefined1 *)((long)ptr + 3) = 0;
          pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,(char *)0x0,&local_60);
          buf_o = local_40;
          iVar19 = 4;
          while (data = (char *)local_48, lVar9 = (long)iVar19, pcVar8 != (char *)0x0) {
            *(char *)((long)ptr + lVar9) = cVar4;
            iVar19 = iVar19 + 2;
            lVar12 = lVar9 << 0x20;
            lVar17 = 0;
            while( true ) {
              lVar12 = lVar12 + 0x100000000;
              if (local_60[lVar17] == '\0') break;
              *(char *)((long)ptr + lVar17 + lVar9 + 1) = local_60[lVar17];
              lVar17 = lVar17 + 1;
              iVar19 = iVar19 + 1;
            }
            *(_Bool *)((long)ptr + (lVar12 >> 0x20)) = _Var3;
            lVar9 = (long)iVar19;
            for (lVar12 = 0; pcVar8[lVar12] != '\0'; lVar12 = lVar12 + 1) {
              *(char *)((long)ptr + lVar12 + lVar9) = pcVar8[lVar12];
              iVar19 = iVar19 + 1;
            }
            pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,local_60,&local_60);
          }
          if (local_58 != (char *)0x0) {
            *(char *)((long)ptr + lVar9) = cVar4;
            *(undefined4 *)((long)ptr + lVar9 + 1) = 0x52455355;
            *(_Bool *)((long)ptr + lVar9 + 5) = _Var3;
            for (lVar9 = 0; local_58[lVar9] != '\0'; lVar9 = lVar9 + 1) {
              *(char *)((long)ptr + lVar9 + (iVar19 + 6)) = local_58[lVar9];
            }
            iVar19 = iVar19 + 6 + (int)lVar9;
          }
          *(undefined2 *)((long)ptr + (long)iVar19) = 0xf0ff;
          pPVar10 = (PlugVtable *)
                    (**(code **)((plug[-0x13].vt)->log + 0x10))
                              (plug[-0x13].vt,ptr,(long)(iVar19 + 2));
          plug[-6].vt = pPVar10;
          pLVar18 = (LogContext *)plug[-0x10].vt;
          pcVar8 = telopt(*(int *)((long)&plug[-5].vt + 4));
          if (iVar19 + 2 == 6) {
            logeventf(pLVar18,"client subnegotiation: SB %s IS <nothing>",pcVar8);
            pcVar8 = local_58;
          }
          else {
            logeventf(pLVar18,"client subnegotiation: SB %s IS:",pcVar8);
            pcVar6 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,(char *)0x0,&local_60);
            while (pcVar8 = local_58, pcVar6 != (char *)0x0) {
              logeventf((LogContext *)plug[-0x10].vt,"    %s=%s",local_60,pcVar6);
              pcVar6 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,local_60,&local_60);
            }
            if (local_58 != (char *)0x0) {
              logeventf((LogContext *)plug[-0x10].vt,"    USER=%s",local_58);
            }
          }
          safefree(ptr);
          goto LAB_00139610;
        }
      }
      else if (iVar19 == 0x20) {
        if (((plug[-4].vt)->receive != (_func_void_Plug_ptr_int_char_ptr_size_t *)0x1) ||
           (*(plug[-4].vt)->closing != (_func_void_Plug_ptr_PlugCloseType_char_ptr)0x1)) {
          pLVar18 = (LogContext *)plug[-0x10].vt;
          pcVar8 = "server subnegotiation: SB TSPEED <something weird>";
          goto LAB_0013934e;
        }
        pcVar6 = conf_get_str((Conf *)plug[-2].vt,0x36);
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)safemalloc(sVar7 + 0x14,1,0);
        pcVar8[0] = -1;
        pcVar8[1] = -6;
        pcVar8[2] = ' ';
        pcVar8[3] = '\0';
        strcpy(pcVar8 + 4,pcVar6);
        sVar7 = strlen(pcVar6);
        lVar9 = sVar7 << 0x20;
        pcVar8[lVar9 + 0x400000000 >> 0x20] = -1;
        pcVar8[lVar9 + 0x500000000 >> 0x20] = -0x10;
        pPVar10 = (PlugVtable *)
                  (**(code **)((plug[-0x13].vt)->log + 0x10))
                            (plug[-0x13].vt,pcVar8,lVar9 + 0x600000000 >> 0x20);
        plug[-6].vt = pPVar10;
        logevent((LogContext *)plug[-0x10].vt,"server subnegotiation: SB TSPEED SEND");
        pLVar18 = (LogContext *)plug[-0x10].vt;
        pcVar16 = "client subnegotiation: SB TSPEED IS %s";
        goto LAB_00139606;
      }
      uVar5 = 0;
      telnet = local_38;
    }
    *(undefined4 *)&plug[-3].vt = uVar5;
LAB_001391a6:
    data = (char *)((byte *)data + 1);
    if (0xfff < buf_o->len) {
      c_write(telnet,buf_o->u,buf_o->len);
      strbuf_clear(buf_o);
    }
  } while( true );
}

Assistant:

static void telnet_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    Telnet *telnet = container_of(plug, Telnet, plug);
    if (urgent)
        telnet->in_synch = true;
    do_telnet_read(telnet, data, len);
}